

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_suite.cpp
# Opt level: O0

void api_dynamic_suite::dynamic_operator_index_const(void)

{
  const_reference piVar1;
  undefined4 local_48 [2];
  undefined4 local_40 [2];
  undefined4 local_38 [2];
  undefined4 local_30 [2];
  undefined1 local_28 [8];
  span<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.tail = (pointer)0x160000000b;
  vista::span<int,_18446744073709551615UL>::span<4UL,_0>
            ((span<int,_18446744073709551615UL> *)local_28,(element_type (*) [4])&span.member.tail);
  piVar1 = vista::span<int,_18446744073709551615UL>::operator[]
                     ((span<int,_18446744073709551615UL> *)local_28,0);
  local_30[0] = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[0]","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xb0,"void api_dynamic_suite::dynamic_operator_index_const()",piVar1,local_30);
  piVar1 = vista::span<int,_18446744073709551615UL>::operator[]
                     ((span<int,_18446744073709551615UL> *)local_28,1);
  local_38[0] = 0x16;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[1]","22",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xb1,"void api_dynamic_suite::dynamic_operator_index_const()",piVar1,local_38);
  piVar1 = vista::span<int,_18446744073709551615UL>::operator[]
                     ((span<int,_18446744073709551615UL> *)local_28,2);
  local_40[0] = 0x21;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[2]","33",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xb2,"void api_dynamic_suite::dynamic_operator_index_const()",piVar1,local_40);
  piVar1 = vista::span<int,_18446744073709551615UL>::operator[]
                     ((span<int,_18446744073709551615UL> *)local_28,3);
  local_48[0] = 0x2c;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[3]","44",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xb3,"void api_dynamic_suite::dynamic_operator_index_const()",piVar1,local_48);
  return;
}

Assistant:

void dynamic_operator_index_const()
{
    int array[4] = { 11, 22, 33, 44 };
    const vista::span<int> span(array);
    BOOST_TEST_EQ(span[0], 11);
    BOOST_TEST_EQ(span[1], 22);
    BOOST_TEST_EQ(span[2], 33);
    BOOST_TEST_EQ(span[3], 44);
}